

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateSerializationConditional
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  Params *pPVar1;
  bool bVar2;
  JavaType type;
  LogMessage *other;
  char *pcVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  pPVar1 = (this->super_FieldGenerator).params_;
  if (pPVar1->use_reference_types_for_primitives_ == true) {
    pcVar3 = "if (this.$name$ != null) {\n";
LAB_002bcfae:
    io::Printer::Print(printer,&this->variables_,pcVar3);
    return;
  }
  pcVar3 = "if (";
  if (pPVar1->generate_has_ != false) {
    pcVar3 = "if (has$capitalized_name$ || ";
  }
  io::Printer::Print(printer,&this->variables_,pcVar3);
  type = GetJavaType(this->descriptor_);
  if (type < (JAVATYPE_MESSAGE|JAVATYPE_LONG)) {
    if (type == JAVATYPE_BYTES) {
      pcVar3 = "!java.util.Arrays.equals(this.$name$, $default$)) {\n";
      goto LAB_002bcfae;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_primitive_field.cc"
               ,0x5d);
    other = internal::LogMessage::operator<<(&local_58,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  bVar2 = anon_unknown_5::IsReferenceType(type);
  if (bVar2) {
    pcVar3 = "!this.$name$.equals($default$)) {\n";
  }
  else if (type == JAVATYPE_DOUBLE) {
    pcVar3 = 
    "java.lang.Double.doubleToLongBits(this.$name$)\n    != java.lang.Double.doubleToLongBits($default$)) {\n"
    ;
  }
  else if (type == JAVATYPE_FLOAT) {
    pcVar3 = 
    "java.lang.Float.floatToIntBits(this.$name$)\n    != java.lang.Float.floatToIntBits($default$)) {\n"
    ;
  }
  else {
    pcVar3 = "this.$name$ != $default$) {\n";
  }
  io::Printer::Print(printer,&this->variables_,pcVar3);
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateSerializationConditional(io::Printer* printer) const {
  if (params_.use_reference_types_for_primitives()) {
    // For reference type mode, serialize based on equality
    // to null.
    printer->Print(variables_,
      "if (this.$name$ != null) {\n");
    return;
  }
  if (params_.generate_has()) {
    printer->Print(variables_,
      "if (has$capitalized_name$ || ");
  } else {
    printer->Print(variables_,
      "if (");
  }
  JavaType java_type = GetJavaType(descriptor_);
  if (IsArrayType(java_type)) {
    printer->Print(variables_,
      "!java.util.Arrays.equals(this.$name$, $default$)) {\n");
  } else if (IsReferenceType(java_type)) {
    printer->Print(variables_,
      "!this.$name$.equals($default$)) {\n");
  } else if (java_type == JAVATYPE_FLOAT) {
    printer->Print(variables_,
      "java.lang.Float.floatToIntBits(this.$name$)\n"
      "    != java.lang.Float.floatToIntBits($default$)) {\n");
  } else if (java_type == JAVATYPE_DOUBLE) {
    printer->Print(variables_,
      "java.lang.Double.doubleToLongBits(this.$name$)\n"
      "    != java.lang.Double.doubleToLongBits($default$)) {\n");
  } else {
    printer->Print(variables_,
      "this.$name$ != $default$) {\n");
  }
}